

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O2

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  uint p;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  N_Vector *v;
  long lVar5;
  realtype **h;
  realtype *q;
  N_Vector z;
  realtype *b_00;
  N_Vector y;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar6;
  undefined8 uVar7;
  code *pcVar8;
  code *pcVar9;
  realtype *stemp;
  N_Vector *vtemp;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  realtype *new_vk_norm;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  realtype rVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ulong uStackY_140;
  ulong local_118;
  double local_78;
  double local_48;
  
  if (S == (SUNLinearSolver)0x0) {
    uStackY_140 = 0xffffffffffffffff;
  }
  else {
    puVar4 = (uint *)S->content;
    p = *puVar4;
    uVar1 = puVar4[2];
    uVar2 = puVar4[3];
    v = *(N_Vector **)(puVar4 + 0x18);
    lVar5 = *(long *)(puVar4 + 0x1a);
    h = *(realtype ***)(puVar4 + 0x1c);
    q = *(realtype **)(puVar4 + 0x1e);
    z = *(N_Vector *)(puVar4 + 0x20);
    b_00 = *(realtype **)(puVar4 + 0x22);
    y = *(N_Vector *)(puVar4 + 0x24);
    x_00 = *(N_Vector *)(puVar4 + 0x14);
    y_00 = *(N_Vector *)(puVar4 + 0x16);
    uVar6 = *(undefined8 *)(puVar4 + 0xc);
    uVar7 = *(undefined8 *)(puVar4 + 0x12);
    pcVar8 = *(code **)(puVar4 + 10);
    pcVar9 = *(code **)(puVar4 + 0x10);
    stemp = *(realtype **)(puVar4 + 0x26);
    vtemp = *(N_Vector **)(puVar4 + 0x28);
    puVar4[4] = 0;
    uVar3 = puVar4[1];
    rVar20 = N_VDotProd(x,x);
    if ((rVar20 != 0.0) || (NAN(rVar20))) {
      iVar10 = (*pcVar8)(uVar6,x,y);
      if (iVar10 != 0) {
LAB_001028b9:
        uStackY_140 = (long)(iVar10 >> 0x1f) ^ 3;
LAB_001028c3:
        *(ulong *)((long)S->content + 0x20) = uStackY_140;
        goto LAB_00102e9f;
      }
      N_VLinearSum(1.0,b,-1.0,y,y);
    }
    else {
      N_VScale(1.0,b,y);
    }
    if (x_00 == (N_Vector)0x0) {
      N_VScale(1.0,y,*v);
    }
    else {
      N_VProd(x_00,y,*v);
    }
    rVar20 = N_VDotProd(*v,*v);
    dVar22 = 0.0;
    if (0.0 < rVar20) {
      rVar20 = N_VDotProd(*v,*v);
      if (rVar20 < 0.0) {
        dVar22 = sqrt(rVar20);
      }
      else {
        dVar22 = SQRT(rVar20);
      }
    }
    *(double *)(puVar4 + 6) = dVar22;
    if (dVar22 <= delta) {
LAB_00102e90:
      *(undefined8 *)((long)S->content + 0x20) = 0;
      uStackY_140 = 0;
    }
    else {
      N_VConst(0.0,z);
      local_118 = 0;
      uVar12 = 0;
      if (0 < (int)p) {
        uVar12 = (ulong)p;
      }
      uVar19 = 0;
      dVar23 = dVar22;
      local_48 = dVar22;
      do {
        lVar17 = 4;
        if ((int)uVar2 < (int)uVar19) {
LAB_00102ebc:
          uStackY_140 = 2;
          if (local_48 < dVar22) {
            N_VLinearSum(1.0,x,1.0,z,x);
            *(undefined8 *)((long)S->content + 0x20) = 1;
            uStackY_140 = 1;
          }
          else {
            *(undefined8 *)((long)S->content + 0x20) = 2;
          }
          goto LAB_00102e9f;
        }
        for (lVar13 = 0; lVar13 <= (int)p; lVar13 = lVar13 + 1) {
          for (uVar15 = 0; p != uVar15; uVar15 = uVar15 + 1) {
            h[lVar13][uVar15] = 0.0;
          }
        }
        local_78 = 1.0;
        uVar15 = 0;
        rVar20 = dVar23;
        while (N_VScale(1.0 / rVar20,v[uVar15],v[uVar15]), uVar12 != uVar15) {
          puVar4[4] = puVar4[4] + 1;
          if (y_00 == (N_Vector)0x0) {
            N_VScale(1.0,v[uVar15],y);
          }
          else {
            N_VDiv(v[uVar15],y_00,y);
          }
          if (uVar3 - 1 < 3) {
            N_VScale(1.0,y,v[uVar15 + 1]);
            iVar10 = (*pcVar9)(delta,uVar7,v[uVar15 + 1],y,2);
            if (iVar10 != 0) {
              uStackY_140 = (long)(iVar10 >> 0x1f) ^ 5;
              goto LAB_001028c3;
            }
          }
          N_VScale(1.0,y,*(N_Vector *)(lVar5 + uVar15 * 8));
          iVar10 = (*pcVar8)(uVar6,y,v[uVar15 + 1]);
          if (iVar10 != 0) goto LAB_001028b9;
          if (x_00 != (N_Vector)0x0) {
            N_VProd(x_00,v[uVar15 + 1],v[uVar15 + 1]);
          }
          local_118 = uVar15 + 1;
          new_vk_norm = (realtype *)((long)h[uVar15 + 1] + lVar17 + -4);
          iVar10 = (int)local_118;
          if (uVar1 == 2) {
            iVar11 = ClassicalGS(v,h,iVar10,p,new_vk_norm,stemp,vtemp);
          }
          else {
            iVar11 = ModifiedGS(v,h,iVar10,p,new_vk_norm);
          }
          if (iVar11 != 0) {
            *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff8;
            uStackY_140 = 0xfffffffffffffff8;
            goto LAB_00102e9f;
          }
          iVar10 = QRfact(iVar10,h,q,(int)uVar15);
          if (iVar10 != 0) {
            *(undefined8 *)((long)S->content + 0x20) = 7;
            uStackY_140 = 7;
            goto LAB_00102e9f;
          }
          local_78 = local_78 * *(double *)((long)q + lVar17 * 2);
          local_48 = ABS(dVar23 * local_78);
          *(double *)(puVar4 + 6) = local_48;
          if (local_48 <= delta) {
            local_118 = (ulong)((int)uVar15 + 1);
            break;
          }
          rVar20 = h[uVar15 + 1][uVar15];
          lVar17 = lVar17 + 8;
          uVar15 = local_118;
        }
        *b_00 = dVar23;
        iVar10 = (int)local_118;
        uVar18 = 0;
        if (0 < iVar10) {
          uVar18 = local_118 & 0xffffffff;
        }
        for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
          b_00[uVar14 + 1] = 0.0;
        }
        iVar11 = QRsol(iVar10,h,q,b_00);
        if (iVar11 != 0) {
          *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff7;
          uStackY_140 = 0xfffffffffffffff7;
          goto LAB_00102e9f;
        }
        *stemp = 1.0;
        *vtemp = z;
        for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
          stemp[uVar14 + 1] = b_00[uVar14];
          vtemp[uVar14 + 1] = *(N_Vector *)(lVar5 + uVar14 * 8);
        }
        iVar11 = N_VLinearCombination(iVar10 + 1,stemp,vtemp,z);
        if (iVar11 != 0) break;
        if ((long)uVar15 < (long)(int)p) {
          N_VLinearSum(1.0,x,1.0,z,x);
          goto LAB_00102e90;
        }
        if (uVar19 == uVar2) goto LAB_00102ebc;
        uVar15 = local_118 & 0xffffffff;
        pdVar16 = q + uVar15 * 2 + -1;
        dVar21 = 1.0;
        for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
          b_00[uVar15] = pdVar16[-1] * dVar21;
          dVar21 = dVar21 * *pdVar16;
          pdVar16 = pdVar16 + -2;
        }
        *b_00 = dVar21;
        for (lVar17 = 0; lVar17 <= iVar10; lVar17 = lVar17 + 1) {
          b_00[lVar17] = b_00[lVar17] * dVar23 * dVar21;
        }
        for (lVar17 = 0; lVar17 <= iVar10; lVar17 = lVar17 + 1) {
          stemp[lVar17] = b_00[lVar17];
          vtemp[lVar17] = v[lVar17];
        }
        dVar23 = ABS(dVar23 * dVar21);
        iVar10 = N_VLinearCombination(iVar10 + 1,stemp,vtemp,*v);
        uVar19 = uVar19 + 1;
      } while (iVar10 == 0);
      uStackY_140 = 0xfffffff6;
    }
  }
LAB_00102e9f:
  return (int)uStackY_140;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnRight, scale1, scale2, converged;
  int i, j, k, l, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  ATimesFn atimes;
  PSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnRight = ( (SPFGMR_CONTENT(S)->pretype == PREC_LEFT) ||
                 (SPFGMR_CONTENT(S)->pretype == PREC_RIGHT) || 
                 (SPFGMR_CONTENT(S)->pretype == PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (N_VDotProd(x, x) == ZERO) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ? 
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1) {
    N_VProd(s1, vtemp, V[0]);   
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries=0; ntries<=max_restarts; ntries++) {
    
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;
    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);
    
    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l=0; l<l_max; l++) {
      
      (*nli)++;
      
      krydim = l + 1;
      
      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);
      
      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */ 
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l+1]);
        ier = psolve(P_data, V[l+1], vtemp, delta, PREC_RIGHT);
        if (ier != 0) {
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      
      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      ier = atimes(A_data, vtemp, V[l+1]);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)  N_VProd(s1, V[l+1], V[l+1]);
      
      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == CLASSICAL_GS) {
        if (ClassicalGS(V, Hes, l+1, l_max, &(Hes[l+1][l]), cv, Xv) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (ModifiedGS(V, Hes, l+1, l_max, &(Hes[l+1][l])) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }
      
      /* Update the QR factorization of Hes. */
      if(QRfact(krydim, Hes, givens, l) != 0 ) {
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }
      
      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);
      if (rho <= delta) { converged = SUNTRUE; break; }
      
      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE/Hes[l+1][l], V[l+1], V[l+1]);
    }
    
    /* Inner loop is done.  Compute the new correction vector xcor. */
    
    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++)  yg[i]=ZERO;
    if (QRsol(krydim, Hes, givens, yg) != 0) {
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }
    
    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = Z[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* If converged, construct the final solution vector x and return. */
    if (converged) {
      N_VLinearSum(ONE, x, ONE, xcor, x); {
        LASTFLAG(S) = SUNLS_SUCCESS;
        return(LASTFLAG(S));
      }
    }
    
    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) break;
    
    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;
    
    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);
    
    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);
    
  }
  
  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {
    N_VLinearSum(ONE, x, ONE, xcor, x); {
      LASTFLAG(S) = SUNLS_RES_REDUCED;
      return(LASTFLAG(S));
    }
  }

  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S)); 
}